

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.hpp
# Opt level: O0

StructType * LLVMBC::dyn_cast<LLVMBC::StructType>(Type *type)

{
  TypeID TVar1;
  TypeID TVar2;
  Type *type_local;
  
  if (type == (Type *)0x0) {
    type_local = (Type *)0x0;
  }
  else {
    TVar1 = Type::getTypeID(type);
    TVar2 = StructType::get_type_id();
    type_local = type;
    if (TVar1 != TVar2) {
      type_local = (Type *)0x0;
    }
  }
  return (StructType *)type_local;
}

Assistant:

inline T *dyn_cast(Type *type)
{
	if (!type)
		return nullptr;

	if (type->getTypeID() != T::get_type_id())
		return nullptr;
	else
		return static_cast<T *>(type);
}